

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::AssertionResult::operator<<(AssertionResult *this,char (*value) [9])

{
  Message msg;
  string local_1c0 [32];
  iuStreamMessage local_1a0;
  
  iu_global_format_stringstream::iu_global_format_stringstream(&local_1a0.m_stream);
  detail::iuStreamMessage::operator<<(&local_1a0,value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string(local_1c0);
  iu_global_format_stringstream::~iu_global_format_stringstream(&local_1a0.m_stream);
  return this;
}

Assistant:

AssertionResult& operator << (const T& value)
    {
        Message msg;
        msg << value;
        m_message += msg.GetString();
        return *this;
    }